

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_tree.hh
# Opt level: O3

pre_order_iterator __thiscall
kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::
append_child<kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator>
          (tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>> *this,
          pre_order_iterator position,Node *x)

{
  tree_node_<htmlcxx2::HTML::Node> *ptVar1;
  tree_node_<htmlcxx2::HTML::Node> **pptVar2;
  tree_node *ptVar3;
  pre_order_iterator pVar4;
  
  ptVar3 = position.super_iterator_base.node;
  if (*(tree_node **)this == ptVar3) {
    __assert_fail("position.node!=head",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Ruzzz[P]htmlcxx/./htmlcxx2/kp_tree.hh"
                  ,0x35d,
                  "iter kp::tree<htmlcxx2::HTML::Node>::append_child(iter, const T &) [T = htmlcxx2::HTML::Node, tree_node_allocator = std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>, iter = kp::tree<htmlcxx2::HTML::Node>::pre_order_iterator]"
                 );
  }
  if (*(tree_node **)(this + 8) != ptVar3) {
    if (ptVar3 != (tree_node *)0x0) {
      pVar4.super_iterator_base.node = (tree_node_<htmlcxx2::HTML::Node> *)operator_new(0xd8);
      (pVar4.super_iterator_base.node)->parent = (tree_node_<htmlcxx2::HTML::Node> *)0x0;
      (pVar4.super_iterator_base.node)->first_child = (tree_node_<htmlcxx2::HTML::Node> *)0x0;
      (pVar4.super_iterator_base.node)->last_child = (tree_node_<htmlcxx2::HTML::Node> *)0x0;
      (pVar4.super_iterator_base.node)->prev_sibling = (tree_node_<htmlcxx2::HTML::Node> *)0x0;
      (pVar4.super_iterator_base.node)->next_sibling = (tree_node_<htmlcxx2::HTML::Node> *)0x0;
      htmlcxx2::HTML::Node::Node(&(pVar4.super_iterator_base.node)->data,x);
      (pVar4.super_iterator_base.node)->first_child = (tree_node_<htmlcxx2::HTML::Node> *)0x0;
      (pVar4.super_iterator_base.node)->last_child = (tree_node_<htmlcxx2::HTML::Node> *)0x0;
      (pVar4.super_iterator_base.node)->parent = ptVar3;
      ptVar1 = ptVar3->last_child;
      pptVar2 = &ptVar1->next_sibling;
      if (ptVar1 == (tree_node_<htmlcxx2::HTML::Node> *)0x0) {
        pptVar2 = &ptVar3->first_child;
      }
      *pptVar2 = pVar4.super_iterator_base.node;
      (pVar4.super_iterator_base.node)->prev_sibling = ptVar1;
      ptVar3->last_child = pVar4.super_iterator_base.node;
      (pVar4.super_iterator_base.node)->next_sibling = (tree_node_<htmlcxx2::HTML::Node> *)0x0;
      pVar4.super_iterator_base._8_8_ = 0;
      return (pre_order_iterator)pVar4.super_iterator_base;
    }
    __assert_fail("position.node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Ruzzz[P]htmlcxx/./htmlcxx2/kp_tree.hh"
                  ,0x35f,
                  "iter kp::tree<htmlcxx2::HTML::Node>::append_child(iter, const T &) [T = htmlcxx2::HTML::Node, tree_node_allocator = std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>, iter = kp::tree<htmlcxx2::HTML::Node>::pre_order_iterator]"
                 );
  }
  __assert_fail("position.node!=feet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Ruzzz[P]htmlcxx/./htmlcxx2/kp_tree.hh"
                ,0x35e,
                "iter kp::tree<htmlcxx2::HTML::Node>::append_child(iter, const T &) [T = htmlcxx2::HTML::Node, tree_node_allocator = std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>, iter = kp::tree<htmlcxx2::HTML::Node>::pre_order_iterator]"
               );
}

Assistant:

iter tree<T, tree_node_allocator>::append_child(iter position, const T& x)
    {
    // If your program fails here you probably used 'append_child' to add the top
    // node to an empty tree. From version 1.45 the top element should be added
    // using 'insert'. See the documentation for further information, and sorry about
    // the API change.
    assert(position.node!=head);
    assert(position.node!=feet);
    assert(position.node);

    tree_node* tmp = alloc_.allocate(1,0);
    alloc_.construct(tmp, x);
//    kp::constructor(&tmp->data, x);
    tmp->first_child=0;
    tmp->last_child=0;

    tmp->parent=position.node;
    if(position.node->last_child!=0) {
        position.node->last_child->next_sibling=tmp;
        }
    else {
        position.node->first_child=tmp;
        }
    tmp->prev_sibling=position.node->last_child;
    position.node->last_child=tmp;
    tmp->next_sibling=0;
    return tmp;
    }